

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.h
# Opt level: O1

WallDuration * __thiscall
miniros::DurationBase<miniros::WallDuration>::operator-=
          (DurationBase<miniros::WallDuration> *this,WallDuration *rhs)

{
  DurationBase<miniros::WallDuration> *pDVar1;
  WallDuration t;
  DurationBase<miniros::WallDuration> local_20;
  
  local_20.sec = 0;
  local_20.nsec = 0;
  pDVar1 = &fromNSec(&local_20,
                     (long)(rhs->super_DurationBase<miniros::WallDuration>).sec * -1000000000 -
                     (long)(rhs->super_DurationBase<miniros::WallDuration>).nsec)->
            super_DurationBase<miniros::WallDuration>;
  local_20.sec = 0;
  local_20.nsec = 0;
  pDVar1 = &fromNSec(&local_20,
                     ((long)(*pDVar1).sec + (long)this->sec) * 1000000000 +
                     ((long)*pDVar1 >> 0x20) + (long)this->nsec)->
            super_DurationBase<miniros::WallDuration>;
  *this = *pDVar1;
  return (WallDuration *)this;
}

Assistant:

T& DurationBase<T>::operator-=(const T &rhs)
  {
    *this += (-rhs);
    return *static_cast<T*>(this);
  }